

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

int_type __thiscall
nlohmann::detail::input_buffer_adapter::get_character(input_buffer_adapter *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->cursor;
  if (this->limit <= pbVar1) {
    return -1;
  }
  if (pbVar1 != (byte *)0x0) {
    this->cursor = (char *)(pbVar1 + 1);
    return (int_type)*pbVar1;
  }
  __assert_fail("cursor != nullptr and limit != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                ,0xfac,
                "virtual std::char_traits<char>::int_type nlohmann::detail::input_buffer_adapter::get_character()"
               );
}

Assistant:

std::char_traits<char>::int_type get_character() noexcept override
    {
        if (JSON_HEDLEY_LIKELY(cursor < limit))
        {
            assert(cursor != nullptr and limit != nullptr);
            return std::char_traits<char>::to_int_type(*(cursor++));
        }

        return std::char_traits<char>::eof();
    }